

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O2

RRStepType __thiscall
OSTEI_HRR_Algorithm_Base::GetKetRRStep(OSTEI_HRR_Algorithm_Base *this,DAM *dam)

{
  RRStepType RVar1;
  mapped_type *pmVar2;
  undefined1 auStack_38 [40];
  
  DAM::notag((DAM *)auStack_38,dam);
  pmVar2 = std::
           map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
           ::at(&this->ketsteps_,(key_type *)auStack_38);
  RVar1 = ((pmVar2->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>)._M_impl.
           super__Vector_impl_data._M_start)->type;
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return RVar1;
}

Assistant:

RRStepType OSTEI_HRR_Algorithm_Base::GetKetRRStep(DAM dam) const
{
    return ketsteps_.at(dam.notag()).begin()->type;
}